

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

bool IsStructReturnType(TypeBase *type)

{
  return false;
}

Assistant:

bool IsStructReturnType(TypeBase *type)
{
#if defined(_WIN64)
	if(isType<TypeVoid>(type))
		return false;

	if(TypeStruct *typeStruct = getType<TypeStruct>(type))
	{
		for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
		{
			if(IsStructReturnType(curr->variable->type))
				return true;
		}
	}
	return type->size != 1 && type->size != 2 && type->size != 4 && type->size != 8;
#else
	(void)type;

	return false;
#endif
}